

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInterface.cpp
# Opt level: O2

HighsStatus __thiscall
Highs::changeColBoundsInterface
          (Highs *this,HighsIndexCollection *index_collection,double *col_lower,double *col_upper)

{
  HighsLogOptions *log_options;
  HighsInt bound_scale;
  HighsIndexCollection *index_collection_00;
  bool bVar1;
  bool bVar2;
  uint uVar3;
  HighsStatus HVar4;
  HighsStatus HVar5;
  ulong uVar6;
  ulong uVar7;
  double dVar8;
  allocator local_131;
  HighsIndexCollection *local_130;
  HighsLogOptions *local_128;
  vector<double,_std::allocator<double>_> local_colUpper;
  vector<double,_std::allocator<double>_> local_colLower;
  string local_f0;
  string local_d0;
  string local_b0;
  HighsLogOptions local_90;
  
  local_130 = index_collection;
  uVar3 = dataSize(index_collection);
  if ((int)uVar3 < 1) {
    return kOk;
  }
  std::__cxx11::string::string((string *)&local_b0,"column lower bounds",(allocator *)&local_f0);
  log_options = &(this->options_).super_HighsOptionsStruct.log_options;
  bVar1 = doubleUserDataNotNull(log_options,col_lower,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::string((string *)&local_d0,"column upper bounds",(allocator *)&local_f0);
  bVar2 = doubleUserDataNotNull(log_options,col_upper,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  if (bVar1 || bVar2) {
    return kError;
  }
  uVar7 = (ulong)uVar3;
  local_128 = log_options;
  std::vector<double,std::allocator<double>>::vector<double_const*,void>
            ((vector<double,std::allocator<double>> *)&local_colLower,col_lower,col_lower + uVar7,
             (allocator_type *)&local_f0);
  std::vector<double,std::allocator<double>>::vector<double_const*,void>
            ((vector<double,std::allocator<double>> *)&local_colUpper,col_upper,col_upper + uVar7,
             (allocator_type *)&local_f0);
  index_collection_00 = local_130;
  if (local_130->is_set_ == true) {
    sortSetData(local_130->set_num_entries_,&local_130->set_,col_lower,col_upper,(double *)0x0,
                local_colLower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start,
                local_colUpper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start,(double *)0x0);
  }
  HighsLogOptions::HighsLogOptions(&local_90,local_128);
  HVar4 = assessBounds(&this->options_,"col",0,index_collection_00,&local_colLower,&local_colUpper,
                       (this->options_).super_HighsOptionsStruct.infinite_bound,(HighsVarType *)0x0)
  ;
  std::__cxx11::string::string((string *)&local_f0,"assessBounds",&local_131);
  HVar5 = interpretCallStatus(&local_90,HVar4,kOk,&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::_Function_base::~_Function_base(&local_90.user_callback.super__Function_base);
  HVar4 = kError;
  if (HVar5 != kError) {
    bound_scale = (this->model_).lp_.user_bound_scale_;
    if (bound_scale != 0) {
      bVar1 = boundScaleOk(&local_colLower,&local_colUpper,bound_scale,
                           (this->options_).super_HighsOptionsStruct.infinite_bound);
      if (!bVar1) {
        highsLogUser(local_128,kError,"User bound scaling yields infinite bound\n");
        goto LAB_00251571;
      }
      dVar8 = ldexp(1.0,(this->model_).lp_.user_bound_scale_);
      for (uVar6 = 0; uVar7 != uVar6; uVar6 = uVar6 + 1) {
        local_colLower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[uVar6] =
             local_colLower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar6] * dVar8;
        local_colUpper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[uVar6] =
             local_colUpper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar6] * dVar8;
      }
    }
    changeLpColBounds(&(this->model_).lp_,local_130,&local_colLower,&local_colUpper);
    setNonbasicStatusInterface(this,local_130,true);
    invalidateModelStatusSolutionAndInfo(this);
    HVar4 = kOk;
    HEkk::updateStatus(&this->ekk_instance_,kNewBounds);
  }
LAB_00251571:
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&local_colUpper.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&local_colLower.super__Vector_base<double,_std::allocator<double>_>);
  return HVar4;
}

Assistant:

HighsStatus Highs::changeColBoundsInterface(
    HighsIndexCollection& index_collection, const double* col_lower,
    const double* col_upper) {
  HighsInt num_col_bounds = dataSize(index_collection);
  // If a non-positive number of costs (may) need changing nothing needs to be
  // done
  if (num_col_bounds <= 0) return HighsStatus::kOk;
  bool null_data = false;
  null_data = doubleUserDataNotNull(options_.log_options, col_lower,
                                    "column lower bounds") ||
              null_data;
  null_data = doubleUserDataNotNull(options_.log_options, col_upper,
                                    "column upper bounds") ||
              null_data;
  if (null_data) return HighsStatus::kError;
  // Take a copy of the cost that can be normalised
  std::vector<double> local_colLower{col_lower, col_lower + num_col_bounds};
  std::vector<double> local_colUpper{col_upper, col_upper + num_col_bounds};
  // If changing the bounds for a set of columns, ensure that the
  // set and data are in ascending order
  if (index_collection.is_set_)
    sortSetData(index_collection.set_num_entries_, index_collection.set_,
                col_lower, col_upper, NULL, local_colLower.data(),
                local_colUpper.data(), NULL);
  HighsStatus return_status = HighsStatus::kOk;
  return_status = interpretCallStatus(
      options_.log_options,
      assessBounds(options_, "col", 0, index_collection, local_colLower,
                   local_colUpper, options_.infinite_bound),
      return_status, "assessBounds");
  if (return_status == HighsStatus::kError) return return_status;
  HighsLp& lp = model_.lp_;
  if (lp.user_bound_scale_) {
    // Assess and apply any user bound scaling
    if (!boundScaleOk(local_colLower, local_colUpper, lp.user_bound_scale_,
                      options_.infinite_bound)) {
      highsLogUser(options_.log_options, HighsLogType::kError,
                   "User bound scaling yields infinite bound\n");
      return HighsStatus::kError;
    }
    double bound_scale_value = std::pow(2, lp.user_bound_scale_);
    for (HighsInt iCol = 0; iCol < num_col_bounds; iCol++) {
      local_colLower[iCol] *= bound_scale_value;
      local_colUpper[iCol] *= bound_scale_value;
    }
  }

  changeLpColBounds(lp, index_collection, local_colLower, local_colUpper);
  // Update HiGHS basis status and (any) simplex move status of
  // nonbasic variables whose bounds have changed
  setNonbasicStatusInterface(index_collection, true);
  // Deduce the consequences of new col bounds
  invalidateModelStatusSolutionAndInfo();
  // Determine any implications for simplex data
  ekk_instance_.updateStatus(LpAction::kNewBounds);
  return HighsStatus::kOk;
}